

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::ClipperOffset::DoOffset(ClipperOffset *this,double delta)

{
  pointer *ppIVar1;
  pointer *ppDVar2;
  int iVar3;
  EndType EVar4;
  pointer pIVar5;
  iterator iVar6;
  IntPoint *pt2;
  double dVar7;
  undefined1 auVar8 [16];
  double *pdVar9;
  pointer pDVar10;
  pointer pDVar11;
  int iVar12;
  iterator iVar13;
  ulong uVar14;
  Paths *this_00;
  uint j;
  ulong uVar15;
  vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *pvVar16;
  uint j_00;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  Path *this_01;
  double dVar20;
  undefined1 auVar21 [8];
  ulong in_XMM0_Qb;
  undefined8 uVar22;
  double dVar23;
  PolyNode *pPVar24;
  int k;
  int k_2;
  undefined1 local_b8 [8];
  double dStack_b0;
  PolyNode *local_a8;
  int local_9c;
  vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *local_98;
  vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_> *local_90;
  Paths *local_88;
  long local_80;
  double local_78;
  ulong uStack_70;
  Path *local_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  this_00 = &this->m_destPolys;
  local_78 = delta;
  uStack_70 = in_XMM0_Qb;
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::_M_erase_at_end(this_00,(this->m_destPolys).
                            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  this->m_delta = local_78;
  local_58 = ABS(local_78);
  uStack_50 = uStack_70 & 0x7fffffffffffffff;
  if (1e-20 <= local_58) {
    dVar20 = this->MiterLimit;
    dVar23 = this->ArcTolerance;
    this->m_miterLim =
         (double)(~-(ulong)(2.0 < dVar20) & 0x3fe0000000000000 |
                 (ulong)(2.0 / (dVar20 * dVar20)) & -(ulong)(2.0 < dVar20));
    if (dVar23 <= 0.0) {
      dVar20 = 0.25;
    }
    else {
      dVar20 = local_58 * 0.25;
      if (dVar23 <= local_58 * 0.25) {
        dVar20 = dVar23;
      }
    }
    dVar20 = acos(1.0 - dVar20 / local_58);
    local_58 = local_58 * 3.141592653589793;
    if (3.141592653589793 / dVar20 <= local_58) {
      local_58 = 3.141592653589793 / dVar20;
    }
    local_a8 = (PolyNode *)(6.283185307179586 / local_58);
    dVar20 = sin((double)local_a8);
    this->m_sin = dVar20;
    dVar20 = cos((double)local_a8);
    this->m_cos = dVar20;
    this->m_StepsPerRad = local_58 / 6.283185307179586;
    if (local_78 < 0.0) {
      this->m_sin = -this->m_sin;
    }
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::reserve(this_00,(long)(int)((ulong)((long)(this->m_polyNodes).Childs.
                                                super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->m_polyNodes).Childs.
                                               super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 2) &
                      0xfffffffffffffffe);
    if (0 < (int)((ulong)((long)(this->m_polyNodes).Childs.
                                super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_polyNodes).Childs.
                               super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
      this_01 = &this->m_srcPoly;
      local_98 = (vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)
                 &this->m_destPoly;
      local_90 = &this->m_normals;
      lVar17 = 0;
      local_88 = this_00;
      local_60 = this_01;
      do {
        local_a8 = (this->m_polyNodes).Childs.
                   super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar17];
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator=
                  (this_01,&local_a8->Contour);
        pvVar16 = local_98;
        uVar15 = (long)(this->m_srcPoly).
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_srcPoly).
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar18 = uVar15 >> 4;
        j_00 = (uint)uVar18;
        if ((j_00 != 0) &&
           ((0.0 < local_78 || ((2 < (int)j_00 && (local_a8->m_endtype == etClosedPolygon)))))) {
          pIVar5 = (this->m_destPoly).
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((this->m_destPoly).
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_finish != pIVar5) {
            (this->m_destPoly).
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_finish = pIVar5;
          }
          local_80 = lVar17;
          if (j_00 == 1) {
            if (local_a8->m_jointype == jtRound) {
              if (1.0 <= local_58) {
                pPVar24 = (PolyNode *)0x0;
                lVar17 = 2;
                dVar20 = 1.0;
                do {
                  pIVar5 = (this->m_srcPoly).
                           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  dVar23 = dVar20 * local_78 + (double)pIVar5->X;
                  uVar18 = -(ulong)(dVar23 < 0.0);
                  local_b8 = (undefined1  [8])
                             (long)((double)(~uVar18 & 0x3fe0000000000000 |
                                            uVar18 & 0xbfe0000000000000) + dVar23);
                  dVar23 = (double)pPVar24 * local_78 + (double)pIVar5->Y;
                  uVar18 = -(ulong)(dVar23 < 0.0);
                  dStack_b0 = (double)(long)((double)(~uVar18 & 0x3fe0000000000000 |
                                                     uVar18 & 0xbfe0000000000000) + dVar23);
                  iVar6._M_current =
                       (this->m_destPoly).
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar6._M_current ==
                      (this->m_destPoly).
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    local_a8 = pPVar24;
                    local_48 = dVar20;
                    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                    _M_realloc_insert<ClipperLib::IntPoint>
                              ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                *)pvVar16,iVar6,(IntPoint *)local_b8);
                    pPVar24 = local_a8;
                    dVar23 = local_48;
                  }
                  else {
                    (iVar6._M_current)->X = (cInt)local_b8;
                    (iVar6._M_current)->Y = (cInt)dStack_b0;
                    ppIVar1 = &(this->m_destPoly).
                               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppIVar1 = *ppIVar1 + 1;
                    dVar23 = dVar20;
                  }
                  dVar20 = dVar23 * this->m_cos - (double)pPVar24 * this->m_sin;
                  pPVar24 = (PolyNode *)((double)pPVar24 * this->m_cos + dVar23 * this->m_sin);
                  dVar23 = (double)lVar17;
                  lVar17 = lVar17 + 1;
                } while (dVar23 <= local_58);
              }
            }
            else {
              iVar12 = 4;
              dVar20 = -1.0;
              uVar22 = 0;
              pPVar24 = (PolyNode *)0xbff0000000000000;
              do {
                pIVar5 = (this->m_srcPoly).
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                dVar23 = (double)pPVar24 * local_78 + (double)pIVar5->X;
                uVar18 = -(ulong)(dVar23 < 0.0);
                local_b8 = (undefined1  [8])
                           (long)((double)(~uVar18 & 0x3fe0000000000000 |
                                          uVar18 & 0xbfe0000000000000) + dVar23);
                dVar23 = dVar20 * local_78 + (double)pIVar5->Y;
                uVar18 = -(ulong)(dVar23 < 0.0);
                dStack_b0 = (double)(long)((double)(~uVar18 & 0x3fe0000000000000 |
                                                   uVar18 & 0xbfe0000000000000) + dVar23);
                iVar6._M_current =
                     (this->m_destPoly).
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar6._M_current ==
                    (this->m_destPoly).
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  local_a8 = pPVar24;
                  local_48 = dVar20;
                  uStack_40 = uVar22;
                  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                  _M_realloc_insert<ClipperLib::IntPoint>
                            ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                             pvVar16,iVar6,(IntPoint *)local_b8);
                  pPVar24 = local_a8;
                  dVar20 = local_48;
                  uVar22 = uStack_40;
                }
                else {
                  (iVar6._M_current)->X = (cInt)local_b8;
                  (iVar6._M_current)->Y = (cInt)dStack_b0;
                  ppIVar1 = &(this->m_destPoly).
                             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppIVar1 = *ppIVar1 + 1;
                }
                if (0.0 <= (double)pPVar24) {
                  if (0.0 <= dVar20) {
                    pPVar24 = (PolyNode *)0xbff0000000000000;
                  }
                  dVar20 = (double)(~-(ulong)(dVar20 < 0.0) & (ulong)dVar20 |
                                   -(ulong)(dVar20 < 0.0) & 0x3ff0000000000000);
                  uVar22 = 0;
                }
                else {
                  pPVar24 = (PolyNode *)0x3ff0000000000000;
                }
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
            }
            std::
            vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ::push_back(this_00,(value_type *)pvVar16);
            lVar17 = local_80;
          }
          else {
            pDVar10 = (this->m_normals).
                      super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((this->m_normals).
                super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                ._M_impl.super__Vector_impl_data._M_finish != pDVar10) {
              (this->m_normals).
              super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
              _M_impl.super__Vector_impl_data._M_finish = pDVar10;
            }
            std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::reserve
                      (local_90,(long)(int)j_00);
            uVar19 = j_00 - 1;
            if (1 < (int)j_00) {
              uVar14 = (ulong)uVar19;
              lVar17 = 0;
              do {
                pIVar5 = (this->m_srcPoly).
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                _local_b8 = GetUnitNormal((IntPoint *)((long)&pIVar5->X + lVar17),
                                          (IntPoint *)((long)&pIVar5[1].X + lVar17));
                iVar13._M_current =
                     (this->m_normals).
                     super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar13._M_current ==
                    (this->m_normals).
                    super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                  _M_realloc_insert<ClipperLib::DoublePoint>
                            (local_90,iVar13,(DoublePoint *)local_b8);
                }
                else {
                  (iVar13._M_current)->X = (double)local_b8;
                  (iVar13._M_current)->Y = dStack_b0;
                  ppDVar2 = &(this->m_normals).
                             super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppDVar2 = *ppDVar2 + 1;
                }
                lVar17 = lVar17 + 0x10;
                uVar14 = uVar14 - 1;
              } while (uVar14 != 0);
            }
            if (local_a8->m_endtype < etOpenButt) {
              pt2 = (this->m_srcPoly).
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start;
              _local_b8 = GetUnitNormal(pt2 + (int)uVar19,pt2);
              iVar13._M_current =
                   (this->m_normals).
                   super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar13._M_current !=
                  (this->m_normals).
                  super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                auVar21 = local_b8;
                dVar20 = dStack_b0;
                goto LAB_00114f0f;
              }
LAB_00114f1a:
              std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
              _M_realloc_insert<ClipperLib::DoublePoint>(local_90,iVar13,(DoublePoint *)local_b8);
            }
            else {
              pDVar10 = (this->m_normals).
                        super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar17 = (long)(uVar15 * 0x10000000 + -0x200000000) >> 0x1c;
              _local_b8 = *(DoublePoint *)((long)&pDVar10->X + lVar17);
              iVar13._M_current =
                   (this->m_normals).
                   super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar13._M_current ==
                  (this->m_normals).
                  super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00114f1a;
              pdVar9 = (double *)((long)&pDVar10->X + lVar17);
              auVar21 = (undefined1  [8])*pdVar9;
              dVar20 = pdVar9[1];
LAB_00114f0f:
              (iVar13._M_current)->X = (double)auVar21;
              (iVar13._M_current)->Y = dVar20;
              ppDVar2 = &(this->m_normals).
                         super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppDVar2 = *ppDVar2 + 1;
            }
            pvVar16 = local_98;
            pPVar24 = local_a8;
            if (local_a8->m_endtype == etClosedLine) {
              local_b8._0_4_ = uVar19;
              if (0 < (int)j_00) {
                j = 0;
                do {
                  OffsetPoint(this,j,(int *)local_b8,pPVar24->m_jointype);
                  j = j + 1;
                } while (j_00 != j);
              }
              this_00 = local_88;
              pvVar16 = local_98;
              std::
              vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              ::push_back(local_88,(value_type *)local_98);
              pPVar24 = local_a8;
              pIVar5 = (this->m_destPoly).
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((this->m_destPoly).
                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                  _M_impl.super__Vector_impl_data._M_finish != pIVar5) {
                (this->m_destPoly).
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_finish = pIVar5;
              }
              pDVar10 = (local_90->
                        super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              dVar20 = pDVar10[(int)uVar19].X;
              dVar23 = pDVar10[(int)uVar19].Y;
              if (1 < (int)j_00) {
                lVar17 = (ulong)uVar19 + 1;
                pDVar11 = pDVar10 + uVar19;
                do {
                  dVar7 = pDVar11[-1].Y;
                  pDVar11->X = -pDVar11[-1].X;
                  pDVar11->Y = -dVar7;
                  pDVar11 = pDVar11 + -1;
                  lVar17 = lVar17 + -1;
                } while (1 < lVar17);
              }
              pDVar10->X = -dVar20;
              pDVar10->Y = -dVar23;
              auVar8._12_4_ = 0;
              auVar8._0_12_ = stack0xffffffffffffff4c;
              _local_b8 = (DoublePoint)(auVar8 << 0x20);
              while (0 < (int)j_00) {
                j_00 = (int)uVar18 - 1;
                uVar18 = (ulong)j_00;
                OffsetPoint(this,j_00,(int *)local_b8,pPVar24->m_jointype);
              }
            }
            else {
              if (local_a8->m_endtype != etClosedPolygon) {
                local_48 = (double)CONCAT44(local_48._4_4_,uVar19);
                local_9c = 0;
                if (2 < (int)j_00) {
                  iVar12 = 1;
                  do {
                    OffsetPoint(this,iVar12,&local_9c,pPVar24->m_jointype);
                    iVar3 = iVar12 - j_00;
                    iVar12 = iVar12 + 1;
                  } while (iVar3 != -2);
                }
                dVar20 = local_48;
                _local_b8 = (DoublePoint)ZEXT816(0);
                EVar4 = pPVar24->m_endtype;
                iVar12 = local_48._0_4_;
                lVar17 = (long)local_48._0_4_;
                if (EVar4 == etOpenButt) {
                  pIVar5 = (this->m_srcPoly).
                           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pDVar10 = (this->m_normals).
                            super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  dVar23 = pDVar10[lVar17].X * local_78 + (double)pIVar5[lVar17].X;
                  uVar18 = -(ulong)(dVar23 < 0.0);
                  local_b8 = (undefined1  [8])
                             (long)((double)(~uVar18 & 0x3fe0000000000000 |
                                            uVar18 & 0xbfe0000000000000) + dVar23);
                  dVar23 = pDVar10[lVar17].Y * local_78 + (double)pIVar5[lVar17].Y;
                  uVar18 = -(ulong)(dVar23 < 0.0);
                  dStack_b0 = (double)(long)((double)(~uVar18 & 0x3fe0000000000000 |
                                                     uVar18 & 0xbfe0000000000000) + dVar23);
                  iVar6._M_current =
                       (this->m_destPoly).
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar6._M_current ==
                      (this->m_destPoly).
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
                    _M_realloc_insert<ClipperLib::IntPoint_const&>
                              (local_98,iVar6,(IntPoint *)local_b8);
                  }
                  else {
                    (iVar6._M_current)->X = (cInt)local_b8;
                    (iVar6._M_current)->Y = (cInt)dStack_b0;
                    ppIVar1 = &(this->m_destPoly).
                               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppIVar1 = *ppIVar1 + 1;
                  }
                  this_00 = local_88;
                  pvVar16 = local_98;
                  pIVar5 = (this->m_srcPoly).
                           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pDVar10 = (this->m_normals).
                            super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  dVar23 = (double)pIVar5[lVar17].X - pDVar10[lVar17].X * local_78;
                  uVar18 = -(ulong)(dVar23 < 0.0);
                  local_b8 = (undefined1  [8])
                             (long)((double)(~uVar18 & 0x3fe0000000000000 |
                                            uVar18 & 0xbfe0000000000000) + dVar23);
                  dVar23 = (double)pIVar5[lVar17].Y - pDVar10[lVar17].Y * local_78;
                  uVar18 = -(ulong)(dVar23 < 0.0);
                  dStack_b0 = (double)(long)((double)(~uVar18 & 0x3fe0000000000000 |
                                                     uVar18 & 0xbfe0000000000000) + dVar23);
                  iVar6._M_current =
                       (this->m_destPoly).
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar6._M_current ==
                      (this->m_destPoly).
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
                    _M_realloc_insert<ClipperLib::IntPoint_const&>
                              (local_98,iVar6,(IntPoint *)local_b8);
                  }
                  else {
                    (iVar6._M_current)->X = (cInt)local_b8;
                    (iVar6._M_current)->Y = (cInt)dStack_b0;
                    ppIVar1 = &(this->m_destPoly).
                               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppIVar1 = *ppIVar1 + 1;
                  }
                }
                else {
                  local_9c = j_00 - 2;
                  this->m_sinA = 0.0;
                  pDVar10 = (this->m_normals).
                            super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pDVar10[lVar17].X = -pDVar10[lVar17].X;
                  pDVar10[lVar17].Y = -pDVar10[lVar17].Y;
                  if (EVar4 == etOpenSquare) {
                    DoSquare(this,local_48._0_4_,local_9c);
                    this_00 = local_88;
                    pvVar16 = local_98;
                  }
                  else {
                    DoRound(this,local_48._0_4_,local_9c);
                    this_00 = local_88;
                    pvVar16 = local_98;
                  }
                }
                pPVar24 = local_a8;
                if (1 < (int)j_00) {
                  lVar17 = ((ulong)dVar20 & 0xffffffff) + 1;
                  pDVar10 = (local_90->
                            super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                            )._M_impl.super__Vector_impl_data._M_start +
                            ((ulong)dVar20 & 0xffffffff);
                  do {
                    dVar20 = pDVar10[-1].Y;
                    pDVar10->X = -pDVar10[-1].X;
                    pDVar10->Y = -dVar20;
                    pDVar10 = pDVar10 + -1;
                    lVar17 = lVar17 + -1;
                  } while (1 < lVar17);
                }
                pDVar10 = (local_90->
                          super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                dVar20 = pDVar10[1].Y;
                pDVar10->X = -pDVar10[1].X;
                pDVar10->Y = -dVar20;
                local_9c = iVar12;
                if (2 < (int)j_00) {
                  do {
                    iVar12 = iVar12 + -1;
                    OffsetPoint(this,iVar12,&local_9c,pPVar24->m_jointype);
                  } while (1 < iVar12);
                }
                this_01 = local_60;
                lVar17 = local_80;
                EVar4 = pPVar24->m_endtype;
                if (EVar4 == etOpenButt) {
                  pIVar5 = (this->m_srcPoly).
                           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pDVar10 = (this->m_normals).
                            super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  dVar20 = (double)pIVar5->X - pDVar10->X * local_78;
                  uVar18 = -(ulong)(dVar20 < 0.0);
                  local_b8 = (undefined1  [8])
                             (long)((double)(~uVar18 & 0x3fe0000000000000 |
                                            uVar18 & 0xbfe0000000000000) + dVar20);
                  dVar20 = (double)pIVar5->Y - pDVar10->Y * local_78;
                  uVar18 = -(ulong)(dVar20 < 0.0);
                  dStack_b0 = (double)(long)((double)(~uVar18 & 0x3fe0000000000000 |
                                                     uVar18 & 0xbfe0000000000000) + dVar20);
                  iVar6._M_current =
                       (this->m_destPoly).
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar6._M_current ==
                      (this->m_destPoly).
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
                    _M_realloc_insert<ClipperLib::IntPoint_const&>
                              (pvVar16,iVar6,(IntPoint *)local_b8);
                  }
                  else {
                    (iVar6._M_current)->X = (cInt)local_b8;
                    (iVar6._M_current)->Y = (cInt)dStack_b0;
                    ppIVar1 = &(this->m_destPoly).
                               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppIVar1 = *ppIVar1 + 1;
                  }
                  pIVar5 = (this->m_srcPoly).
                           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pDVar10 = (this->m_normals).
                            super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  dVar20 = pDVar10->X * local_78 + (double)pIVar5->X;
                  uVar18 = -(ulong)(dVar20 < 0.0);
                  local_b8 = (undefined1  [8])
                             (long)((double)(~uVar18 & 0x3fe0000000000000 |
                                            uVar18 & 0xbfe0000000000000) + dVar20);
                  dVar20 = pDVar10->Y * local_78 + (double)pIVar5->Y;
                  uVar18 = -(ulong)(dVar20 < 0.0);
                  dStack_b0 = (double)(long)((double)(~uVar18 & 0x3fe0000000000000 |
                                                     uVar18 & 0xbfe0000000000000) + dVar20);
                  iVar6._M_current =
                       (this->m_destPoly).
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar6._M_current ==
                      (this->m_destPoly).
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
                    _M_realloc_insert<ClipperLib::IntPoint_const&>
                              (pvVar16,iVar6,(IntPoint *)local_b8);
                  }
                  else {
                    (iVar6._M_current)->X = (cInt)local_b8;
                    (iVar6._M_current)->Y = (cInt)dStack_b0;
                    ppIVar1 = &(this->m_destPoly).
                               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppIVar1 = *ppIVar1 + 1;
                  }
                }
                else {
                  local_9c = 1;
                  this->m_sinA = 0.0;
                  if (EVar4 == etOpenSquare) {
                    DoSquare(this,0,1);
                  }
                  else {
                    DoRound(this,0,1);
                  }
                }
                std::
                vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                ::push_back(this_00,(value_type *)pvVar16);
                goto LAB_00115066;
              }
              local_b8._0_4_ = uVar19;
              this_00 = local_88;
              if (0 < (int)j_00) {
                uVar19 = 0;
                do {
                  OffsetPoint(this,uVar19,(int *)local_b8,pPVar24->m_jointype);
                  uVar19 = uVar19 + 1;
                  this_00 = local_88;
                } while (j_00 != uVar19);
              }
            }
            std::
            vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ::push_back(this_00,(value_type *)pvVar16);
            lVar17 = local_80;
            this_01 = local_60;
          }
        }
LAB_00115066:
        lVar17 = lVar17 + 1;
      } while (lVar17 < (int)((ulong)((long)(this->m_polyNodes).Childs.
                                            super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->m_polyNodes).Childs.
                                           super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3));
    }
  }
  else {
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::reserve(this_00,(long)(int)((ulong)((long)(this->m_polyNodes).Childs.
                                                super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->m_polyNodes).Childs.
                                               super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3));
    if (0 < (int)((ulong)((long)(this->m_polyNodes).Childs.
                                super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_polyNodes).Childs.
                               super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
      lVar17 = 0;
      do {
        pPVar24 = (this->m_polyNodes).Childs.
                  super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar17];
        if (pPVar24->m_endtype == etClosedPolygon) {
          std::
          vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
          ::push_back(this_00,&pPVar24->Contour);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < (int)((ulong)((long)(this->m_polyNodes).Childs.
                                            super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->m_polyNodes).Childs.
                                           super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3));
    }
  }
  return;
}

Assistant:

void ClipperOffset::DoOffset(double delta)
{
  m_destPolys.clear();
  m_delta = delta;

  //if Zero offset, just copy any CLOSED polygons to m_p and return ...
  if (NEAR_ZERO(delta)) 
  {
    m_destPolys.reserve(m_polyNodes.ChildCount());
    for (int i = 0; i < m_polyNodes.ChildCount(); i++)
    {
      PolyNode& node = *m_polyNodes.Childs[i];
      if (node.m_endtype == etClosedPolygon)
        m_destPolys.push_back(node.Contour);
    }
    return;
  }

  //see offset_triginometry3.svg in the documentation folder ...
  if (MiterLimit > 2) m_miterLim = 2/(MiterLimit * MiterLimit);
  else m_miterLim = 0.5;

  double y;
  if (ArcTolerance <= 0.0) y = def_arc_tolerance;
  else if (ArcTolerance > std::fabs(delta) * def_arc_tolerance) 
    y = std::fabs(delta) * def_arc_tolerance;
  else y = ArcTolerance;
  //see offset_triginometry2.svg in the documentation folder ...
  double steps = pi / std::acos(1 - y / std::fabs(delta));
  if (steps > std::fabs(delta) * pi) 
    steps = std::fabs(delta) * pi;  //ie excessive precision check
  m_sin = std::sin(two_pi / steps);
  m_cos = std::cos(two_pi / steps);
  m_StepsPerRad = steps / two_pi;
  if (delta < 0.0) m_sin = -m_sin;

  m_destPolys.reserve(m_polyNodes.ChildCount() * 2);
  for (int i = 0; i < m_polyNodes.ChildCount(); i++)
  {
    PolyNode& node = *m_polyNodes.Childs[i];
    m_srcPoly = node.Contour;

    int len = (int)m_srcPoly.size();
    if (len == 0 || (delta <= 0 && (len < 3 || node.m_endtype != etClosedPolygon)))
        continue;

    m_destPoly.clear();
    if (len == 1)
    {
      if (node.m_jointype == jtRound)
      {
        double X = 1.0, Y = 0.0;
        for (cInt j = 1; j <= steps; j++)
        {
          m_destPoly.push_back(IntPoint(
            Round(m_srcPoly[0].X + X * delta),
            Round(m_srcPoly[0].Y + Y * delta)));
          double X2 = X;
          X = X * m_cos - m_sin * Y;
          Y = X2 * m_sin + Y * m_cos;
        }
      }
      else
      {
        double X = -1.0, Y = -1.0;
        for (int j = 0; j < 4; ++j)
        {
          m_destPoly.push_back(IntPoint(
            Round(m_srcPoly[0].X + X * delta),
            Round(m_srcPoly[0].Y + Y * delta)));
          if (X < 0) X = 1;
          else if (Y < 0) Y = 1;
          else X = -1;
        }
      }
      m_destPolys.push_back(m_destPoly);
      continue;
    }
    //build m_normals ...
    m_normals.clear();
    m_normals.reserve(len);
    for (int j = 0; j < len - 1; ++j)
      m_normals.push_back(GetUnitNormal(m_srcPoly[j], m_srcPoly[j + 1]));
    if (node.m_endtype == etClosedLine || node.m_endtype == etClosedPolygon)
      m_normals.push_back(GetUnitNormal(m_srcPoly[len - 1], m_srcPoly[0]));
    else
      m_normals.push_back(DoublePoint(m_normals[len - 2]));

    if (node.m_endtype == etClosedPolygon)
    {
      int k = len - 1;
      for (int j = 0; j < len; ++j)
        OffsetPoint(j, k, node.m_jointype);
      m_destPolys.push_back(m_destPoly);
    }
    else if (node.m_endtype == etClosedLine)
    {
      int k = len - 1;
      for (int j = 0; j < len; ++j)
        OffsetPoint(j, k, node.m_jointype);
      m_destPolys.push_back(m_destPoly);
      m_destPoly.clear();
      //re-build m_normals ...
      DoublePoint n = m_normals[len -1];
      for (int j = len - 1; j > 0; j--)
        m_normals[j] = DoublePoint(-m_normals[j - 1].X, -m_normals[j - 1].Y);
      m_normals[0] = DoublePoint(-n.X, -n.Y);
      k = 0;
      for (int j = len - 1; j >= 0; j--)
        OffsetPoint(j, k, node.m_jointype);
      m_destPolys.push_back(m_destPoly);
    }
    else
    {
      int k = 0;
      for (int j = 1; j < len - 1; ++j)
        OffsetPoint(j, k, node.m_jointype);

      IntPoint pt1;
      if (node.m_endtype == etOpenButt)
      {
        int j = len - 1;
        pt1 = IntPoint((cInt)Round(m_srcPoly[j].X + m_normals[j].X *
          delta), (cInt)Round(m_srcPoly[j].Y + m_normals[j].Y * delta));
        m_destPoly.push_back(pt1);
        pt1 = IntPoint((cInt)Round(m_srcPoly[j].X - m_normals[j].X *
          delta), (cInt)Round(m_srcPoly[j].Y - m_normals[j].Y * delta));
        m_destPoly.push_back(pt1);
      }
      else
      {
        int j = len - 1;
        k = len - 2;
        m_sinA = 0;
        m_normals[j] = DoublePoint(-m_normals[j].X, -m_normals[j].Y);
        if (node.m_endtype == etOpenSquare)
          DoSquare(j, k);
        else
          DoRound(j, k);
      }

      //re-build m_normals ...
      for (int j = len - 1; j > 0; j--)
        m_normals[j] = DoublePoint(-m_normals[j - 1].X, -m_normals[j - 1].Y);
      m_normals[0] = DoublePoint(-m_normals[1].X, -m_normals[1].Y);

      k = len - 1;
      for (int j = k - 1; j > 0; --j) OffsetPoint(j, k, node.m_jointype);

      if (node.m_endtype == etOpenButt)
      {
        pt1 = IntPoint((cInt)Round(m_srcPoly[0].X - m_normals[0].X * delta),
          (cInt)Round(m_srcPoly[0].Y - m_normals[0].Y * delta));
        m_destPoly.push_back(pt1);
        pt1 = IntPoint((cInt)Round(m_srcPoly[0].X + m_normals[0].X * delta),
          (cInt)Round(m_srcPoly[0].Y + m_normals[0].Y * delta));
        m_destPoly.push_back(pt1);
      }
      else
      {
        k = 1;
        m_sinA = 0;
        if (node.m_endtype == etOpenSquare)
          DoSquare(0, 1);
        else
          DoRound(0, 1);
      }
      m_destPolys.push_back(m_destPoly);
    }
  }
}